

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const.c
# Opt level: O0

char segment_symbol(size_t i)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  vec2i BC;
  vec2i AB;
  char symbol;
  size_t i_local;
  
  AB.x._3_1_ = '?';
  if (i == 0) {
    AB.x._3_1_ = '@';
  }
  else if (i == (long)(g.snake.len + -1)) {
    if (g.snake.seg[i].x == g.snake.seg[i - 1].x) {
      AB.x._3_1_ = -0x46;
    }
    if (g.snake.seg[i].y == g.snake.seg[i - 1].y) {
      AB.x._3_1_ = -0x33;
    }
  }
  else {
    iVar5 = g.snake.seg[i].x - g.snake.seg[i - 1].x;
    iVar6 = g.snake.seg[i].y - g.snake.seg[i - 1].y;
    iVar1 = g.snake.seg[i + 1].x;
    iVar2 = g.snake.seg[i].x;
    iVar7 = iVar1 - iVar2;
    iVar3 = g.snake.seg[i + 1].y;
    iVar4 = g.snake.seg[i].y;
    iVar8 = iVar3 - iVar4;
    if ((iVar6 == -1) || (1 < iVar6)) {
      if (iVar1 == iVar2) {
        AB.x._3_1_ = -0x46;
      }
      else if ((iVar7 == -1) || (1 < iVar7)) {
        AB.x._3_1_ = -0x45;
      }
      else if ((iVar7 == 1) || (iVar7 < -1)) {
        AB.x._3_1_ = -0x37;
      }
    }
    else if ((iVar6 == 1) || (iVar6 < -1)) {
      if (iVar1 == iVar2) {
        AB.x._3_1_ = -0x46;
      }
      else if ((iVar7 == -1) || (1 < iVar7)) {
        AB.x._3_1_ = -0x44;
      }
      else if ((iVar7 == 1) || (iVar7 < -1)) {
        AB.x._3_1_ = -0x38;
      }
    }
    else if ((iVar5 == -1) || (1 < iVar5)) {
      if (iVar3 == iVar4) {
        AB.x._3_1_ = -0x33;
      }
      else if ((iVar8 == -1) || (1 < iVar8)) {
        AB.x._3_1_ = -0x38;
      }
      else if ((iVar8 == 1) || (iVar8 < -1)) {
        AB.x._3_1_ = -0x37;
      }
    }
    else if ((iVar5 == 1) || (iVar5 < -1)) {
      if (iVar3 == iVar4) {
        AB.x._3_1_ = -0x33;
      }
      else if ((iVar8 == -1) || (1 < iVar8)) {
        AB.x._3_1_ = -0x44;
      }
      else if ((iVar8 == 1) || (iVar8 < -1)) {
        AB.x._3_1_ = -0x45;
      }
    }
  }
  return AB.x._3_1_;
}

Assistant:

char segment_symbol(size_t i) {
    char symbol = '?';
    if (i == 0) { /* Head */
        symbol = seg_head;
    } else if (i == g.snake.len-1) { /* Last segment of the tail */
        if (g.snake.seg[i].x - g.snake.seg[i-1].x == 0) symbol = seg_v;
        if (g.snake.seg[i].y - g.snake.seg[i-1].y == 0) symbol = seg_h;
    } else {
        vec2i AB = { g.snake.seg[i].x - g.snake.seg[i-1].x, g.snake.seg[i].y - g.snake.seg[i-1].y };
        vec2i BC = { g.snake.seg[i+1].x - g.snake.seg[i].x, g.snake.seg[i+1].y - g.snake.seg[i].y };
        /* Moving away from head: segment A(i-1) to segment C(i+1) through B(i).
         * The second condition of each if branch is used to ensure proper transitions
         * to the opposite part of the screen (for example on EASY level). */
        if (AB.y == -1 || AB.y > 1) { /* up */
            if (BC.x == 0) /* up */
                symbol = seg_v; /* vertical */
            else if (BC.x == -1 || BC.x >  1)
                symbol = seg_ul; /* up and left */
            else if (BC.x ==  1 || BC.x < -1)
                symbol = seg_ur; /* up and right */
        } else if (AB.y == 1 || AB.y < -1) { /* down */
            if (BC.x == 0) /* down */
                symbol = seg_v; /* vertical */
            else if (BC.x == -1 || BC.x >  1)
                symbol = seg_dl; /* down and left */
            else if (BC.x ==  1 || BC.x < -1)
                symbol = seg_dr; /* down and right */
        } else if (AB.x == -1 || AB.x > 1) { /* left */
            if (BC.y == 0) /* left */
                symbol = seg_h; /* horizontal */
            else if (BC.y == -1 || BC.y >  1)
                symbol = seg_lu; /* left and up */
            else if (BC.y ==  1 || BC.y < -1)
                symbol = seg_ld; /* left and down */
        } else if (AB.x == 1 || AB.x < -1) { /* right */
            if (BC.y == 0) /* right */
                symbol = seg_h; /* horizontal */
            else if (BC.y == -1 || BC.y >  1)
                symbol = seg_ru; /* right and up */
            else if (BC.y ==  1 || BC.y < -1)
                symbol = seg_rd; /* right and down */
        }
    }

    return symbol;
}